

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Picture.cpp
# Opt level: O1

Color * __thiscall Picture::getColor(Color *__return_storage_ptr__,Picture *this,double x,double y)

{
  uint uVar1;
  int iVar2;
  Vec3b *pVVar3;
  uint uVar4;
  Color *pCVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  long lVar15;
  bool bVar16;
  double dVar17;
  double dVar18;
  ushort local_9c;
  byte local_9a;
  Color *local_98;
  long local_90;
  ulong local_88;
  ulong local_80;
  double local_78;
  double local_70;
  Vector3 local_68;
  Vector3 local_48;
  
  dVar18 = 0.0;
  if (0.0 <= x) {
    dVar18 = x;
  }
  local_78 = 1.0;
  if (dVar18 <= 1.0) {
    local_78 = dVar18;
  }
  dVar18 = 0.0;
  if (0.0 <= y) {
    dVar18 = y;
  }
  dVar17 = 1.0;
  if (dVar18 <= 1.0) {
    dVar17 = dVar18;
  }
  local_70 = (double)(this->rows + -1) * (1.0 - dVar17);
  uVar6 = (uint)local_70;
  local_88 = (ulong)uVar6;
  local_78 = (double)(this->cols + -1) * local_78;
  iVar11 = (int)local_78;
  local_48.x = 0.0;
  local_48.y = 0.0;
  local_48.z = 0.0;
  local_90 = (long)iVar11;
  uVar9 = 0;
  local_98 = __return_storage_ptr__;
  do {
    uVar14 = (int)uVar9 + (int)local_88;
    lVar15 = local_90;
    iVar13 = 0;
    local_80 = uVar9;
    do {
      uVar1 = this->rows;
      uVar4 = uVar14;
      if ((int)uVar1 < (int)uVar14) {
        uVar4 = uVar1;
      }
      iVar12 = iVar13 + iVar11;
      iVar2 = this->cols;
      if (iVar2 < iVar12) {
        iVar12 = iVar2;
      }
      lVar10 = (long)iVar2;
      if (lVar15 < iVar2) {
        lVar10 = lVar15;
      }
      if ((int)uVar6 <= (int)uVar1) {
        uVar1 = uVar6;
      }
      pVVar3 = this->data;
      lVar7 = 0;
      do {
        iVar8 = (int)ROUND((double)pVVar3[lVar10 + (int)(uVar1 * iVar2)].
                                   super_Matx<unsigned_char,_3,_1>.val[lVar7] *
                           (1.0 - ABS(local_78 - (double)iVar12)) *
                           (1.0 - ABS(local_70 - (double)(int)uVar4)));
        if (iVar8 < 1) {
          iVar8 = 0;
        }
        if (0xfe < iVar8) {
          iVar8 = 0xff;
        }
        *(char *)((long)&local_9c + lVar7) = (char)iVar8;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 3);
      local_68.x = (double)(local_9c & 0xff);
      local_68.y = (double)(byte)(local_9c >> 8);
      local_68.z = (double)local_9a;
      operator+=(&local_48,&local_68);
      pCVar5 = local_98;
      lVar15 = lVar15 + 1;
      bVar16 = iVar13 == 0;
      iVar13 = iVar13 + 1;
    } while (bVar16);
    uVar6 = uVar6 + 1;
    uVar9 = (ulong)((int)local_80 + 1);
  } while ((int)local_80 == 0);
  local_68.x = 255.0;
  operator/(&local_48,&local_68.x);
  return pCVar5;
}

Assistant:

Color Picture::getColor(double x, double y) const
{
    x = min(max(x, 0.), 1.);
    y = min(max(y, 0.), 1.);
    y = (1 - y) * (rows - 1);
    x = x * (cols - 1);
    Color res;
    for (int i = 0; i < 2; ++i)
        for (int j = 0; j < 2; ++j) {
            int ny = std::min(int(y) + i, this->rows);
            int nx = std::min(int(x) + j, this->cols);
            res += (1 - fabs(y - ny)) * (1 - fabs(x - nx)) * (*this)[ny][nx];
        }
    return res / 255;
}